

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O1

MPP_RET hal_jpege_vepu2_part_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  long lVar2;
  MPP_RET MVar3;
  MPP_RET MVar4;
  RK_U32 RVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)(*(int *)((long)hal + 0x28) * (task->flags).reg_idx);
  lVar2 = *(long *)((long)hal + 0x20);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter part wait %p\n","hal_jpege_vepu2_part_wait",hal);
  }
  if (*hal == (MppDev)0x0) {
    MVar3 = MPP_OK;
  }
  else {
    MVar4 = mpp_dev_ioctl(*hal,0x10,(void *)0x0);
    MVar3 = MPP_OK;
    if (MVar4 != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vepu2","poll cmd failed %d\n","hal_jpege_vepu2_part_wait",
                 (ulong)(uint)MVar4);
      MVar3 = MVar4;
    }
  }
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","hw_status %08x\n",(char *)0x0,
               (ulong)*(uint *)(lVar2 + 0x1b4 + uVar6));
  }
  uVar1 = *(uint *)(lVar2 + 0xd4 + uVar6);
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","byte pos %d -> %d\n",(char *)0x0,
               (ulong)*(uint *)((long)hal + 0x11c),
               (ulong)((uVar1 >> 3) + (*(uint *)((long)hal + 0x11c) & 0xfffffff8)));
  }
  RVar5 = (*(uint *)((long)hal + 0x11c) & 0xfffffff8) + (uVar1 >> 3);
  *(RK_U32 *)((long)hal + 0x11c) = RVar5;
  *(RK_U32 *)((long)hal + 0xfc) = RVar5;
  task->length = RVar5;
  task->hw_length = RVar5 - *(int *)((long)hal + 0x150);
  if (((byte)hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","stream_length %d, hw_byte %d",(char *)0x0);
  }
  if (((byte)hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","stream bit: sw %d hw %d total %d hw_length %d\n",(char *)0x0,
               (ulong)*(uint *)((long)hal + 0x118),(ulong)uVar1,(ulong)*(uint *)((long)hal + 0xfc),
               (ulong)(uint)task->hw_length);
  }
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave part wait %p\n","hal_jpege_vepu2_part_wait",hal);
  }
  return MVar3;
}

Assistant:

MPP_RET hal_jpege_vepu2_part_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    RK_S32 reg_idx = task->flags.reg_idx;
    RK_U32 *regs = (RK_U32 *)((RK_U8 *)ctx->regs_out + ctx->reg_size * reg_idx);
    JpegeFeedback *feedback = &ctx->feedback;
    RK_U32 hw_bit = 0;

    hal_jpege_dbg_func("enter part wait %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    }

    hal_jpege_dbg_detail("hw_status %08x\n", regs[109]);

    hw_bit = regs[53];

    hal_jpege_dbg_detail("byte pos %d -> %d\n", ctx->part_bytepos,
                         (ctx->part_bytepos & (~7)) + (hw_bit / 8));
    ctx->part_bytepos = (ctx->part_bytepos & (~7)) + (hw_bit / 8);

    feedback->stream_length = ctx->part_bytepos;
    task->length = ctx->part_bytepos;
    task->hw_length = task->length - ctx->hal_start_pos;

    hal_jpege_dbg_detail("stream_length %d, hw_byte %d",
                         feedback->stream_length, hw_bit / 8);

    hal_jpege_dbg_output("stream bit: sw %d hw %d total %d hw_length %d\n",
                         ctx->sw_bit, hw_bit, feedback->stream_length, task->hw_length);

    hal_jpege_dbg_func("leave part wait %p\n", hal);
    return ret;
}